

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O3

void __thiscall vera::HaveDefines::HaveDefines(HaveDefines *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_HaveDefines = (_func_int **)&PTR__HaveDefines_003da100;
  p_Var1 = &(this->m_defines)._M_t._M_impl.super__Rb_tree_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_defineChange = false;
  return;
}

Assistant:

HaveDefines::HaveDefines() : m_defineChange(false) {
}